

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  uint uVar1;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    enc_local._4_4_ = -1;
  }
  else {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 0x14:
      *nextTokPtr = ptr + 1;
      enc_local._4_4_ = 0x21;
      break;
    default:
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
      break;
    case 0x16:
    case 0x18:
      for (end_local = ptr + 1; 0 < (long)end - (long)end_local; end_local = end_local + 1) {
        uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
        if ((uVar1 - 9 < 2) || (uVar1 == 0x15)) {
LAB_0069abb6:
          *nextTokPtr = end_local;
          return 0x10;
        }
        if ((uVar1 != 0x16) && (uVar1 != 0x18)) {
          if (uVar1 != 0x1e) {
            *nextTokPtr = end_local;
            return 0;
          }
          if ((long)end - (long)end_local < 2) {
            return -1;
          }
          uVar1 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
          if (((uVar1 - 9 < 2) || (uVar1 == 0x15)) || (uVar1 == 0x1e)) {
            *nextTokPtr = end_local;
            return 0;
          }
          goto LAB_0069abb6;
        }
      }
      enc_local._4_4_ = -1;
      break;
    case 0x1b:
      enc_local._4_4_ = normal_scanComment(enc,ptr + 1,end,nextTokPtr);
    }
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(scanDecl)(const ENCODING *enc, const char *ptr,
                 const char *end, const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      REQUIRE_CHARS(enc, ptr, end, 2);
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S: case BT_CR: case BT_LF: case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}